

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

uchar __thiscall IDisk::GetNextByteForRev(IDisk *this,int side,uint track,uint offset,int rev)

{
  uint uVar1;
  Revolution *pRVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = offset + 1;
  pRVar2 = this->side_[side].tracks[track].revolution;
  uVar1 = pRVar2[rev].size;
  uVar6 = 0xfffffffe;
  bVar4 = 0;
  do {
    uVar3 = uVar1;
    if (uVar5 < uVar1) {
      uVar3 = 0;
    }
    bVar4 = pRVar2[rev].bitfield[uVar5 - uVar3] & 1 | bVar4 * '\x02';
    uVar5 = (uVar5 - uVar3) + 2;
    uVar6 = uVar6 + 2;
  } while (uVar6 < 0xe);
  return bVar4;
}

Assistant:

unsigned char IDisk::GetNextByteForRev(int side, unsigned int track, unsigned int offset, int rev)
{
   unsigned char return_value = 0;

   //
   offset++;
   for (int i = 0; i < 16; i += 2)
   {
      return_value <<= 1;
      if (offset >= side_[side].tracks[track].revolution[rev].size)
         offset = offset - side_[side].tracks[track].revolution[rev].size;

      unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[offset];

      return_value |= b & 0x1;
      offset += 2;
   }

   return return_value;
}